

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O2

bool __thiscall QO_Manager::UseCondition(QO_Manager *this,int relsJoined,int condIndex,int relIdx)

{
  Condition *pCVar1;
  bool bVar2;
  RelAttr attr;
  RelAttr attr_00;
  RelAttr attr_01;
  int firstRel_1;
  int secondRel;
  int firstRel;
  
  pCVar1 = this->conds;
  if (pCVar1[condIndex].bRhsIsAttr == 0) {
    attr_01.attrName = pCVar1[condIndex].lhsAttr.attrName;
    attr_01.relName = pCVar1[condIndex].lhsAttr.relName;
    AttrToRelIndex(this,attr_01,&firstRel_1);
    if (firstRel_1 == relIdx) {
      return true;
    }
LAB_0011273b:
    bVar2 = false;
  }
  else {
    attr.attrName = pCVar1[condIndex].lhsAttr.attrName;
    attr.relName = pCVar1[condIndex].lhsAttr.relName;
    AttrToRelIndex(this,attr,&firstRel);
    attr_00.attrName = this->conds[condIndex].rhsAttr.attrName;
    attr_00.relName = this->conds[condIndex].rhsAttr.relName;
    AttrToRelIndex(this,attr_00,&secondRel);
    if ((1 << ((byte)firstRel & 0x1f) & relsJoined) == 0 && (uint)firstRel < 0x21 ||
        secondRel != relIdx) {
      if ((firstRel != relIdx) ||
         ((uint)secondRel < 0x21 && (1 << ((byte)secondRel & 0x1f) & relsJoined) == 0)) {
        if (secondRel == relIdx && firstRel == relIdx) {
          return true;
        }
        goto LAB_0011273b;
      }
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool QO_Manager::UseCondition(int relsJoined, int condIndex, int relIdx){
  // If attributes on both sides, one of the attributes must fall within
  // the relation specified by relIdx, and the other must be in a relation
  // specified in relsJoined
  if(conds[condIndex].bRhsIsAttr){
    int firstRel, secondRel;
    AttrToRelIndex(conds[condIndex].lhsAttr, firstRel);
    AttrToRelIndex(conds[condIndex].rhsAttr, secondRel);
    bool firstBitSet = IsBitSet(firstRel, relsJoined);
    bool secondBitSet = IsBitSet(secondRel, relsJoined);
    if(firstBitSet && secondRel == relIdx)
      return true;
    else if(secondBitSet && firstRel == relIdx)
      return true;
    else if(firstRel == relIdx && secondRel == relIdx)
      return true;
  }
  // If attr-value comparison, then the condition must be of the relation
  // specified by relIdx
  else{
    int firstRel;
    AttrToRelIndex(conds[condIndex].lhsAttr, firstRel);
    if(firstRel == relIdx)
      return true;
  }
  return false;
}